

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseSwitchExpr(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  undefined8 *puVar7;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> casePredicate;
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> caseBody;
  Token keyword;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> value;
  vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> cases;
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  undefined1 local_d0 [24];
  undefined8 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  TokenType local_a0;
  col_t local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  TokenType local_68;
  col_t local_64;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  parseExpr((Parser *)local_60);
  local_e0 = (undefined1  [8])local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"Expected \'{\' before switch expression body.","");
  expect(in_RSI,LEFT_BRACE,(string *)local_e0);
  local_60._16_8_ = this;
  if (local_e0 != (undefined1  [8])local_d0) {
    operator_delete((void *)local_e0,local_d0._0_8_ + 1);
  }
  local_60._24_8_ = 0;
  aStack_40._0_8_ = (__node_base_ptr)0x0;
  aStack_40._8_8_ = (__node_base_ptr)0x0;
  local_60._8_8_ = &(in_RSI->m_previous).line;
LAB_0010df21:
  TVar1 = (in_RSI->m_current).type;
  if ((TVar1 == RIGHT_BRACE) || (TVar1 == END_OF_FILE)) {
    local_e0 = (undefined1  [8])local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Expected \'}\' after switch expression body.","");
    expect(in_RSI,RIGHT_BRACE,(string *)local_e0);
    uVar5 = local_60._16_8_;
    if (local_e0 != (undefined1  [8])local_d0) {
      operator_delete((void *)local_e0,local_d0._0_8_ + 1);
    }
    puVar7 = (undefined8 *)operator_new(0x28);
    uVar4 = local_60._0_8_;
    local_60._0_8_ = (_Hash_node_base *)0x0;
    *puVar7 = &PTR__SwitchExpr_001294c8;
    puVar7[1] = uVar4;
    puVar7[2] = local_60._24_8_;
    puVar7[3] = aStack_40._0_8_;
    puVar7[4] = aStack_40._8_8_;
    aStack_40._8_8_ = (__node_base_ptr)0x0;
    local_60._24_8_ = 0;
    aStack_40._0_8_ = (__node_base_ptr)0x0;
    *(undefined8 **)uVar5 = puVar7;
    std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::~vector
              ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)(local_60 + 0x18));
    if ((_Hash_node_base *)local_60._0_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_60._0_8_)[1]._M_nxt)();
    }
    return (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>)(Expr *)uVar5;
  }
  if (TVar1 != CASE) goto LAB_0010e005;
  advance(in_RSI);
  local_98._8_4_ = (in_RSI->m_previous).type;
  local_88._0_8_ = &local_78;
  pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
  local_64 = *(col_t *)((long)(_Hash_node_base **)local_60._8_8_ + 4);
  local_68 = *(TokenType *)(_Hash_node_base **)local_60._8_8_;
  parseExpr((Parser *)local_e0);
  plVar6 = (long *)operator_new(0x10);
  auVar3 = local_e0;
  local_e0 = (undefined1  [8])0x0;
  *plVar6 = (long)&PTR__ValuePattern_001293e0;
  plVar6[1] = (long)auVar3;
  if ((in_RSI->m_current).type == WHEN) {
    advance(in_RSI);
    parseExpr((Parser *)local_e8);
  }
  else {
    local_e0 = (undefined1  [8])0x0;
    local_e8 = (undefined1  [8])operator_new(0x10);
    (((CompileContext *)local_e8)->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_00129438;
    *(undefined1 *)&(((CompileContext *)local_e8)->m_source)._M_string_length = 1;
  }
  local_e0 = (undefined1  [8])local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,"Expected \'{\' or \'=>\' before switch case body.","");
  expectBlock((Parser *)local_98,(string *)in_RSI);
  if (local_e0 != (undefined1  [8])local_d0) {
    operator_delete((void *)local_e0,local_d0._0_8_ + 1);
  }
  local_d8._M_p = (pointer)local_e8;
  local_e8 = (undefined1  [8])0x0;
  local_d0._0_8_ = local_98._0_8_;
  local_98._0_8_ = (long *)0x0;
  local_d0._8_4_ = local_98._8_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ == &local_78) {
    local_b0._8_8_ = local_78._8_8_;
    local_d0._16_8_ = &local_b0;
  }
  else {
    local_d0._16_8_ = local_88._0_8_;
  }
  local_b0._M_allocated_capacity._1_7_ = local_78._1_7_;
  local_b0._M_local_buf[0] = local_78._M_local_buf[0];
  local_b8 = local_88._8_8_;
  local_88._8_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  local_9c = local_64;
  local_a0 = local_68;
  local_e0 = (undefined1  [8])plVar6;
  local_88._0_8_ = &local_78;
  std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::
  emplace_back<enact::SwitchCase>
            ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)(local_60 + 0x18),
             (SwitchCase *)local_e0);
  goto LAB_0010e36b;
LAB_0010e005:
  if ((in_RSI->m_current).type == DEFAULT) {
    advance(in_RSI);
    local_98._8_4_ = (in_RSI->m_previous).type;
    local_88._0_8_ = &local_78;
    pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
    local_64 = *(col_t *)((long)(_Hash_node_base **)local_60._8_8_ + 4);
    local_68 = *(TokenType *)(_Hash_node_base **)local_60._8_8_;
    plVar6 = (long *)operator_new(0x38);
    local_e0._0_4_ = local_98._8_4_;
    pcVar2 = local_d0 + 8;
    local_d8._M_p = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_88._0_8_,local_88._8_8_ + local_88._0_8_);
    local_b8 = CONCAT44(CONCAT22(local_b8._6_2_,local_64),local_68);
    *plVar6 = (long)&PTR__WildcardPattern_00129480;
    *(undefined4 *)(plVar6 + 1) = local_e0._0_4_;
    plVar6[2] = (long)(plVar6 + 4);
    if (local_d8._M_p == pcVar2) {
      plVar6[4] = CONCAT44(local_d0._12_4_,local_d0._8_4_);
      plVar6[5] = local_d0._16_8_;
    }
    else {
      plVar6[2] = (long)local_d8._M_p;
      plVar6[4] = CONCAT44(local_d0._12_4_,local_d0._8_4_);
    }
    plVar6[3] = local_d0._0_8_;
    local_d0._0_8_ = 0;
    local_d0._8_4_ = local_d0._8_4_ & 0xffffff00;
    *(col_t *)((long)plVar6 + 0x34) = local_64;
    *(TokenType *)(plVar6 + 6) = local_68;
    if ((in_RSI->m_current).type == WHEN) {
      local_d8._M_p = pcVar2;
      advance(in_RSI);
      parseExpr((Parser *)local_e8);
    }
    else {
      local_d0._0_8_ = 0;
      local_d8._M_p = pcVar2;
      local_e8 = (undefined1  [8])operator_new(0x10);
      (((CompileContext *)local_e8)->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_00129438;
      *(undefined1 *)&(((CompileContext *)local_e8)->m_source)._M_string_length = 1;
    }
    local_e0 = (undefined1  [8])local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Expected \'{\' or \'=>\' before default switch case body.","");
    expectBlock((Parser *)local_98,(string *)in_RSI);
    if (local_e0 != (undefined1  [8])local_d0) {
      operator_delete((void *)local_e0,local_d0._0_8_ + 1);
    }
    local_d8._M_p = (pointer)local_e8;
    local_e8 = (undefined1  [8])0x0;
    local_d0._0_8_ = local_98._0_8_;
    local_98._0_8_ = (long *)0x0;
    local_d0._8_4_ = local_98._8_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ == &local_78) {
      local_b0._8_8_ = local_78._8_8_;
      local_d0._16_8_ = &local_b0;
    }
    else {
      local_d0._16_8_ = local_88._0_8_;
    }
    local_b0._M_allocated_capacity._1_7_ = local_78._1_7_;
    local_b0._M_local_buf[0] = local_78._M_local_buf[0];
    local_b8 = local_88._8_8_;
    local_88._8_8_ = 0;
    local_78._M_local_buf[0] = '\0';
    local_9c = local_64;
    local_a0 = local_68;
    local_e0 = (undefined1  [8])plVar6;
    local_88._0_8_ = &local_78;
    std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::
    emplace_back<enact::SwitchCase>
              ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)(local_60 + 0x18),
               (SwitchCase *)local_e0);
LAB_0010e36b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._16_8_ != &local_b0) {
      operator_delete((void *)local_d0._16_8_,local_b0._M_allocated_capacity + 1);
    }
    if ((long *)local_d0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_d0._0_8_ + 8))();
    }
    local_d0._0_8_ = 0;
    if ((CompileContext *)local_d8._M_p != (CompileContext *)0x0) {
      (**(code **)(*(long *)local_d8._M_p + 8))();
    }
    local_d8._M_p = (pointer)0x0;
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
    }
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_e8)->_M_dataplus)._M_p + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ != &local_78) {
      operator_delete((void *)local_88._0_8_,CONCAT71(local_78._1_7_,local_78._M_local_buf[0]) + 1);
    }
  }
  goto LAB_0010df21;
}

Assistant:

std::unique_ptr<Expr> Parser::parseSwitchExpr() {
        std::unique_ptr<Expr> value = parseExpr();
        expect(TokenType::LEFT_BRACE, "Expected '{' before switch expression body.");

        std::vector<SwitchCase> cases;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::CASE)) {
                Token keyword = m_previous;

                // TODO: add more pattern types
                std::unique_ptr<Pattern> casePattern = std::make_unique<ValuePattern>(parseExpr());
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                    ? parseExpr()
                                                    : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern), std::move(casePredicate), std::move(caseBody), std::move(keyword)});
            } else if (consume(TokenType::DEFAULT)) {
                Token keyword = m_previous;

                std::unique_ptr<Pattern> casePattern = std::make_unique<WildcardPattern>(keyword);
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                      ? parseExpr()
                                                      : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before default switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern),
                                           std::move(casePredicate),
                                           std::move(caseBody),
                                           std::move(keyword)});
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after switch expression body.");

        return std::make_unique<SwitchExpr>(std::move(value), std::move(cases));
    }